

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::MaxTextureLevels
          (TextureAttachmentTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  double dVar5;
  int local_2c;
  long lStack_28;
  GLint max_texture_size;
  Functions *gl;
  TextureAttachmentTest *pTStack_18;
  GLenum texture_target_local;
  TextureAttachmentTest *this_local;
  
  gl._4_4_ = texture_target;
  pTStack_18 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0x400;
  if (gl._4_4_ == 0xde1) {
    (**(code **)(lStack_28 + 0x868))(0xd33,&local_2c);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2c5);
    dVar5 = ::log((double)local_2c);
    this_local._4_4_ = (GLuint)(long)dVar5;
  }
  else {
    if (gl._4_4_ != 0x84f5) {
      if (gl._4_4_ == 0x8513) {
        (**(code **)(lStack_28 + 0x868))(0x851c,&local_2c);
        dVar2 = (**(code **)(lStack_28 + 0x800))();
        glu::checkError(dVar2,"glBindFramebuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x2cb);
        dVar5 = ::log((double)local_2c);
        return (GLuint)(long)dVar5;
      }
      if (gl._4_4_ != 0x9100) {
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLuint TextureAttachmentTest::MaxTextureLevels(glw::GLenum texture_target)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_texture_size = 1024 /* Specification default. */;

	switch (texture_target)
	{
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_2D_MULTISAMPLE:
		return 1;

	case GL_TEXTURE_2D:
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (glw::GLuint)std::log((double)max_texture_size);

	case GL_TEXTURE_CUBE_MAP:
		gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (glw::GLuint)std::log((double)max_texture_size);

	default:
		throw 0;
	}

	/* For compiler warnings only. */
	return 0;
}